

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPublicKey.cpp
# Opt level: O2

bool __thiscall ECPublicKey::deserialise(ECPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dQ;
  ByteString dEC;
  ByteString BStack_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&BStack_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&BStack_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x38))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x40))(this,&BStack_68);
      goto LAB_0012c654;
    }
  }
  bVar2 = false;
LAB_0012c654:
  ByteString::~ByteString(&BStack_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool ECPublicKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dQ.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setQ(dQ);

	return true;
}